

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FboColorbufferCase::compare
          (FboColorbufferCase *this,Surface *reference,Surface *result)

{
  ostringstream *this_00;
  TestLog *log;
  bool bVar1;
  RGBA RVar2;
  ConstPixelBufferAccess local_1d0;
  undefined1 local_1a8 [384];
  
  RVar2 = FboTestUtil::getFormatThreshold(this->m_format);
  RVar2 = tcu::max(RVar2,(RGBA)0xc0c0c0c);
  local_1a8._0_8_ =
       ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Comparing images, threshold: ");
  tcu::operator<<((ostream *)this_00,RVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  log = ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::getAccess((ConstPixelBufferAccess *)local_1a8,reference);
  tcu::Surface::getAccess(&local_1d0,result);
  bVar1 = tcu::bilinearCompare
                    (log,"Result","Image comparison result",(ConstPixelBufferAccess *)local_1a8,
                     &local_1d0,RVar2,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_format), MIN_THRESHOLD));

		m_testCtx.getLog() << TestLog::Message << "Comparing images, threshold: " << threshold << TestLog::EndMessage;

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}